

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void handleAbsEvent(_GLFWjoystick *js,int code,int value)

{
  int axis_00;
  int (*paiVar1) [2];
  int iVar2;
  float fVar3;
  float local_3c;
  int range;
  float normalized;
  input_absinfo *info;
  int *state;
  int axis;
  int hat;
  int index;
  int value_local;
  int code_local;
  _GLFWjoystick *js_local;
  
  axis_00 = (js->linjs).absMap[code];
  if ((code < 0x10) || (0x17 < code)) {
    local_3c = (float)value;
    iVar2 = (js->linjs).absInfo[code].maximum - (js->linjs).absInfo[code].minimum;
    if (iVar2 != 0) {
      fVar3 = (local_3c - (float)(js->linjs).absInfo[code].minimum) / (float)iVar2;
      local_3c = fVar3 + fVar3 + -1.0;
    }
    _glfwInputJoystickAxis(js,axis_00,local_3c);
  }
  else {
    iVar2 = (code + -0x10) % 2;
    paiVar1 = (js->linjs).hats + (code + -0x10) / 2;
    if (value == 0) {
      (*paiVar1)[iVar2] = 0;
    }
    else if (value < 0) {
      (*paiVar1)[iVar2] = 1;
    }
    else if (0 < value) {
      (*paiVar1)[iVar2] = 2;
    }
    _glfwInputJoystickHat(js,axis_00,handleAbsEvent::stateMap[(*paiVar1)[0]][(*paiVar1)[1]]);
  }
  return;
}

Assistant:

static void handleAbsEvent(_GLFWjoystick* js, int code, int value)
{
    const int index = js->linjs.absMap[code];

    if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
    {
        static const char stateMap[3][3] =
        {
            { GLFW_HAT_CENTERED, GLFW_HAT_UP,       GLFW_HAT_DOWN },
            { GLFW_HAT_LEFT,     GLFW_HAT_LEFT_UP,  GLFW_HAT_LEFT_DOWN },
            { GLFW_HAT_RIGHT,    GLFW_HAT_RIGHT_UP, GLFW_HAT_RIGHT_DOWN },
        };

        const int hat = (code - ABS_HAT0X) / 2;
        const int axis = (code - ABS_HAT0X) % 2;
        int* state = js->linjs.hats[hat];

        // NOTE: Looking at several input drivers, it seems all hat events use
        //       -1 for left / up, 0 for centered and 1 for right / down
        if (value == 0)
            state[axis] = 0;
        else if (value < 0)
            state[axis] = 1;
        else if (value > 0)
            state[axis] = 2;

        _glfwInputJoystickHat(js, index, stateMap[state[0]][state[1]]);
    }
    else
    {
        const struct input_absinfo* info = &js->linjs.absInfo[code];
        float normalized = value;

        const int range = info->maximum - info->minimum;
        if (range)
        {
            // Normalize to 0.0 -> 1.0
            normalized = (normalized - info->minimum) / range;
            // Normalize to -1.0 -> 1.0
            normalized = normalized * 2.0f - 1.0f;
        }

        _glfwInputJoystickAxis(js, index, normalized);
    }
}